

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void test_static_delete_all_all(planck_unit_test_t *tc)

{
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t config_00;
  ion_dictionary_config_info_t config_01;
  ion_dictionary_config_info_t config_02;
  ion_dictionary_config_info_t config_03;
  Dictionary<int,_int> *pDVar1;
  
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  config.type = key_type_numeric_signed;
  config.key_size = 4;
  config.id = 1;
  config.use_type = '\0';
  config._5_3_ = 0;
  config.value_size = 4;
  config.dictionary_size = 100;
  config.dictionary_type = dictionary_type_bpp_tree_t;
  config.dictionary_status = '\0';
  config._29_3_ = 0;
  BppTree<int,_int>::BppTree((BppTree<int,_int> *)pDVar1,config);
  test_cpp_wrapper_delete_all(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  config_00.type = key_type_numeric_signed;
  config_00.key_size = 4;
  config_00.id = 1;
  config_00.use_type = '\0';
  config_00._5_3_ = 0;
  config_00.value_size = 4;
  config_00.dictionary_size = 100;
  config_00.dictionary_type = dictionary_type_skip_list_t;
  config_00.dictionary_status = '\0';
  config_00._29_3_ = 0;
  SkipList<int,_int>::SkipList((SkipList<int,_int> *)pDVar1,config_00);
  test_cpp_wrapper_delete_all(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  config_01.type = key_type_numeric_signed;
  config_01.key_size = 4;
  config_01.id = 1;
  config_01.use_type = '\0';
  config_01._5_3_ = 0;
  config_01.value_size = 4;
  config_01.dictionary_size = 100;
  config_01.dictionary_type = dictionary_type_flat_file_t;
  config_01.dictionary_status = '\0';
  config_01._29_3_ = 0;
  FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)pDVar1,config_01);
  test_cpp_wrapper_delete_all(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  config_02.type = key_type_numeric_signed;
  config_02.key_size = 4;
  config_02.id = 1;
  config_02.use_type = '\0';
  config_02._5_3_ = 0;
  config_02.value_size = 4;
  config_02.dictionary_size = 0xa0;
  config_02.dictionary_type = dictionary_type_open_address_hash_t;
  config_02.dictionary_status = '\0';
  config_02._29_3_ = 0;
  OpenAddressHash<int,_int>::OpenAddressHash((OpenAddressHash<int,_int> *)pDVar1,config_02);
  test_cpp_wrapper_delete_all(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  config_03.type = key_type_numeric_signed;
  config_03.key_size = 4;
  config_03.id = 1;
  config_03.use_type = '\0';
  config_03._5_3_ = 0;
  config_03.value_size = 4;
  config_03.dictionary_size = 0xa0;
  config_03.dictionary_type = dictionary_type_open_address_file_hash_t;
  config_03.dictionary_status = '\0';
  config_03._29_3_ = 0;
  OpenAddressFileHash<int,_int>::OpenAddressFileHash
            ((OpenAddressFileHash<int,_int> *)pDVar1,config_03);
  test_cpp_wrapper_delete_all(tc,pDVar1);
  dictionary_delete_dictionary(&pDVar1->dict);
  operator_delete(pDVar1);
  return;
}

Assistant:

void
test_static_delete_all_all(
	planck_unit_test_t *tc
) {
	Dictionary<int, int> *dict;

	ion_dictionary_config_info_t config = {
		.id = 1, .use_type = 0, .type = key_type_numeric_signed, .key_size = sizeof(int), .value_size = sizeof(int), .dictionary_size = 100, .dictionary_type = dictionary_type_bpp_tree_t, .dictionary_status = err_ok
	};

	int type = 0;

	dict = BppTree<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_delete_all(tc, dict);
	delete dict;

	config.dictionary_size	= 100;
	config.dictionary_type	= dictionary_type_skip_list_t;

	dict					= SkipList<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_delete_all(tc, dict);
	delete dict;

	config.dictionary_size	= 100;
	config.dictionary_type	= dictionary_type_flat_file_t;

	dict					= FlatFile<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_delete_all(tc, dict);
	delete dict;

	config.dictionary_size	= 160;
	config.dictionary_type	= dictionary_type_open_address_hash_t;

	dict					= OpenAddressHash<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_delete_all(tc, dict);
	delete dict;

	config.dictionary_size	= 160;
	config.dictionary_type	= dictionary_type_open_address_file_hash_t;

	dict					= OpenAddressFileHash<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_delete_all(tc, dict);
	delete dict;

	/* Uncomment when LinearHash dictionary open memory issue fixed. */
/*	config.dictionary_size = 100; */
/*	config.dictionary_type = dictionary_type_linear_hash_t}; */
/*  */
/*	dict = LinearHash<int, int>::openDictionary(config, type, type); */
/*	test_cpp_wrapper_delete_all(tc, dict); */
/*	delete dict; */
}